

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void ConvertYUV444ToRGB_SSE2(__m128i *Y0,__m128i *U0,__m128i *V0,__m128i *R,__m128i *G,__m128i *B)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 (*in_R8) [16];
  ushort *in_R9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i R2;
  __m128i R1;
  __m128i R0;
  __m128i Y1;
  __m128i k8708;
  __m128i k13320;
  __m128i k6419;
  __m128i k17685;
  __m128i k33050;
  __m128i k14234;
  __m128i k26149;
  __m128i k19077;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i G4;
  __m128i G3;
  __m128i G2;
  __m128i G1;
  __m128i G0;
  
  auVar6._8_8_ = 0x4a854a854a854a85;
  auVar6._0_8_ = 0x4a854a854a854a85;
  auVar6 = pmulhuw(*in_RDI,auVar6);
  auVar2._8_8_ = 0x6625662566256625;
  auVar2._0_8_ = 0x6625662566256625;
  auVar7 = pmulhuw(*in_RDX,auVar2);
  local_118 = auVar6._0_2_;
  sStack_116 = auVar6._2_2_;
  sStack_114 = auVar6._4_2_;
  sStack_112 = auVar6._6_2_;
  sStack_110 = auVar6._8_2_;
  sStack_10e = auVar6._10_2_;
  sStack_10c = auVar6._12_2_;
  sStack_10a = auVar6._14_2_;
  local_c8 = auVar7._0_2_;
  sStack_c6 = auVar7._2_2_;
  sStack_c4 = auVar7._4_2_;
  sStack_c2 = auVar7._6_2_;
  sStack_c0 = auVar7._8_2_;
  sStack_be = auVar7._10_2_;
  sStack_bc = auVar7._12_2_;
  sStack_ba = auVar7._14_2_;
  auVar1._8_8_ = 0x1913191319131913;
  auVar1._0_8_ = 0x1913191319131913;
  auVar7 = pmulhuw(*in_RSI,auVar1);
  auVar8._8_8_ = 0x3408340834083408;
  auVar8._0_8_ = 0x3408340834083408;
  auVar8 = pmulhuw(*in_RDX,auVar8);
  local_f8 = auVar7._0_2_;
  sStack_f6 = auVar7._2_2_;
  sStack_f4 = auVar7._4_2_;
  sStack_f2 = auVar7._6_2_;
  sStack_f0 = auVar7._8_2_;
  sStack_ee = auVar7._10_2_;
  sStack_ec = auVar7._12_2_;
  sStack_ea = auVar7._14_2_;
  local_108 = auVar8._0_2_;
  sStack_106 = auVar8._2_2_;
  sStack_104 = auVar8._4_2_;
  sStack_102 = auVar8._6_2_;
  sStack_100 = auVar8._8_2_;
  sStack_fe = auVar8._10_2_;
  sStack_fc = auVar8._12_2_;
  sStack_fa = auVar8._14_2_;
  auVar7._8_8_ = 0x811a811a811a811a;
  auVar7._0_8_ = 0x811a811a811a811a;
  auVar7 = pmulhuw(*in_RSI,auVar7);
  auVar7 = paddusw(auVar7,auVar6);
  auVar3._8_8_ = 0x4515451545154515;
  auVar3._0_8_ = 0x4515451545154515;
  auVar7 = psubusw(auVar7,auVar3);
  auVar5._2_2_ = sStack_116 + -0x379a + sStack_c6;
  auVar5._0_2_ = local_118 + -0x379a + local_c8;
  auVar5._4_2_ = sStack_114 + -0x379a + sStack_c4;
  auVar5._6_2_ = sStack_112 + -0x379a + sStack_c2;
  auVar5._10_2_ = sStack_10e + -0x379a + sStack_be;
  auVar5._8_2_ = sStack_110 + -0x379a + sStack_c0;
  auVar5._12_2_ = sStack_10c + -0x379a + sStack_bc;
  auVar5._14_2_ = sStack_10a + -0x379a + sStack_ba;
  auVar8 = psraw(auVar5,ZEXT416(6));
  *in_RCX = auVar8;
  auVar4._2_2_ = (sStack_116 + 0x2204) - (sStack_f6 + sStack_106);
  auVar4._0_2_ = (local_118 + 0x2204) - (local_f8 + local_108);
  auVar4._4_2_ = (sStack_114 + 0x2204) - (sStack_f4 + sStack_104);
  auVar4._6_2_ = (sStack_112 + 0x2204) - (sStack_f2 + sStack_102);
  auVar4._10_2_ = (sStack_10e + 0x2204) - (sStack_ee + sStack_fe);
  auVar4._8_2_ = (sStack_110 + 0x2204) - (sStack_f0 + sStack_100);
  auVar4._12_2_ = (sStack_10c + 0x2204) - (sStack_ec + sStack_fc);
  auVar4._14_2_ = (sStack_10a + 0x2204) - (sStack_ea + sStack_fa);
  auVar8 = psraw(auVar4,ZEXT416(6));
  *in_R8 = auVar8;
  G1[1]._0_2_ = auVar7._0_2_;
  G1[1]._2_2_ = auVar7._2_2_;
  G1[1]._4_2_ = auVar7._4_2_;
  G1[1]._6_2_ = auVar7._6_2_;
  G0[0]._0_2_ = auVar7._8_2_;
  G0[0]._2_2_ = auVar7._10_2_;
  G0[0]._4_2_ = auVar7._12_2_;
  G0[0]._6_2_ = auVar7._14_2_;
  *in_R9 = (ushort)G1[1] >> 6;
  in_R9[1] = G1[1]._2_2_ >> 6;
  in_R9[2] = G1[1]._4_2_ >> 6;
  in_R9[3] = G1[1]._6_2_ >> 6;
  in_R9[4] = (ushort)G0[0] >> 6;
  in_R9[5] = G0[0]._2_2_ >> 6;
  in_R9[6] = G0[0]._4_2_ >> 6;
  in_R9[7] = G0[0]._6_2_ >> 6;
  return;
}

Assistant:

static void ConvertYUV444ToRGB_SSE2(const __m128i* const Y0,
                                    const __m128i* const U0,
                                    const __m128i* const V0,
                                    __m128i* const R,
                                    __m128i* const G,
                                    __m128i* const B) {
  const __m128i k19077 = _mm_set1_epi16(19077);
  const __m128i k26149 = _mm_set1_epi16(26149);
  const __m128i k14234 = _mm_set1_epi16(14234);
  // 33050 doesn't fit in a signed short: only use this with unsigned arithmetic
  const __m128i k33050 = _mm_set1_epi16((short)33050);
  const __m128i k17685 = _mm_set1_epi16(17685);
  const __m128i k6419  = _mm_set1_epi16(6419);
  const __m128i k13320 = _mm_set1_epi16(13320);
  const __m128i k8708  = _mm_set1_epi16(8708);

  const __m128i Y1 = _mm_mulhi_epu16(*Y0, k19077);

  const __m128i R0 = _mm_mulhi_epu16(*V0, k26149);
  const __m128i R1 = _mm_sub_epi16(Y1, k14234);
  const __m128i R2 = _mm_add_epi16(R1, R0);

  const __m128i G0 = _mm_mulhi_epu16(*U0, k6419);
  const __m128i G1 = _mm_mulhi_epu16(*V0, k13320);
  const __m128i G2 = _mm_add_epi16(Y1, k8708);
  const __m128i G3 = _mm_add_epi16(G0, G1);
  const __m128i G4 = _mm_sub_epi16(G2, G3);

  // be careful with the saturated *unsigned* arithmetic here!
  const __m128i B0 = _mm_mulhi_epu16(*U0, k33050);
  const __m128i B1 = _mm_adds_epu16(B0, Y1);
  const __m128i B2 = _mm_subs_epu16(B1, k17685);

  // use logical shift for B2, which can be larger than 32767
  *R = _mm_srai_epi16(R2, 6);   // range: [-14234, 30815]
  *G = _mm_srai_epi16(G4, 6);   // range: [-10953, 27710]
  *B = _mm_srli_epi16(B2, 6);   // range: [0, 34238]
}